

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialMatrix * __thiscall
RigidBodyDynamics::Math::SpatialTransform::toMatrixTranspose(SpatialTransform *this)

{
  CoeffReturnType pdVar1;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *this_00;
  SpatialMatrix *in_RDI;
  Matrix3d _Erx;
  SpatialMatrix *result;
  Index in_stack_fffffffffffffdd8;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_fffffffffffffde0;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_01;
  DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *this_02;
  double *in_stack_fffffffffffffe48;
  double *in_stack_fffffffffffffe50;
  double *in_stack_fffffffffffffe58;
  double *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe68;
  Matrix3_t *in_stack_fffffffffffffe70;
  double *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe88;
  double *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  undefined8 local_e8;
  double local_e0;
  double local_d8 [3];
  undefined8 local_c0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_70;
  
  local_c0 = 0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_d8[2] = -*pdVar1;
  this_00 = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_d8[1] = 0.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_d8[0] = -*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_e0 = -*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_e8 = 0;
  other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_d8;
  this_01 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_e0;
  this_02 = (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)&local_e8;
  Matrix3_t::Matrix3_t
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe98);
  local_70 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(this_01,other);
  Matrix3_t::
  Matrix3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix3_t *)this_01,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)other);
  SpatialMatrix_t::SpatialMatrix_t((SpatialMatrix_t *)0x1553a5);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_02,(Index)pdVar1,(Index)this_01);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_01,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::operator-(this_00);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_02,(Index)pdVar1,(Index)this_01);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_01,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero((Index)pdVar1,(Index)this_01);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_02,(Index)pdVar1,(Index)this_01);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_01,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_02,(Index)pdVar1,(Index)this_01);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_01,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)other);
  return in_RDI;
}

Assistant:

SpatialMatrix toMatrixTranspose () const {
		Matrix3d _Erx =
			E * Matrix3d (
					0., -r[2], r[1],
					r[2], 0., -r[0],
					-r[1], r[0], 0.
					);
		SpatialMatrix result;
		result.block<3,3>(0,0) = E.transpose();
		result.block<3,3>(0,3) = -_Erx.transpose();
		result.block<3,3>(3,0) = Matrix3d::Zero(3,3);
		result.block<3,3>(3,3) = E.transpose();

		return result;
	}